

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Order_sum_Test::~Order_sum_Test(Order_sum_Test *this)

{
  Order_sum_Test *this_local;
  
  ~Order_sum_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Order, sum)
{
    auto const d = symbol("d");
    auto const c = symbol("c");
    auto const b = symbol("b");
    auto const a = symbol("a");

    EXPECT_EQ(toString(a + b), "(+ a b)");
    EXPECT_EQ(toString(a + c), "(+ a c)");
    EXPECT_EQ(toString(a + c + d), "(+ a c d)");
    EXPECT_EQ(toString(b + c + d), "(+ b c d)");
    EXPECT_TRUE(less(a + b, a + c));
    EXPECT_TRUE(less(a + c + d, b + c + d));
}